

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O1

result<toml::basic_value<toml::type_config>_*,_toml::error_info> *
toml::detail::insert_value<toml::type_config>
          (result<toml::basic_value<toml::type_config>_*,_toml::error_info> *__return_storage_ptr__,
          inserting_value_kind kind,table_type *current_table_ptr,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *keys,region *key_reg,basic_value<toml::type_config> *val)

{
  anon_union_88_2_fd5fb55d_for_result<toml::basic_value<toml::type_config>_*,_toml::error_info>_3
  *this;
  basic_value<toml::type_config> *pbVar1;
  key_type *k;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pbVar3;
  char *pcVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  size_t sVar6;
  size_t sVar7;
  size_t sVar8;
  size_t sVar9;
  size_t sVar10;
  bool bVar11;
  iterator iVar12;
  table_format_info *ptVar13;
  table_type *ptVar14;
  value_type *pvVar15;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_true>
  _Var16;
  array_format_info *paVar17;
  pointer pbVar18;
  vector<toml::basic_value<toml::type_config>,std::allocator<toml::basic_value<toml::type_config>>>
  *this_00;
  array_type *paVar19;
  undefined8 uVar20;
  uint uVar21;
  char *pcVar22;
  uint uVar23;
  key_type *__k;
  undefined7 in_register_00000031;
  key_type *pkVar24;
  _Alloc_hider _Var25;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar26;
  __node_base *p_Var27;
  ulong uVar28;
  initializer_list<toml::basic_value<toml::type_config>_> __l;
  table_format_info fmt;
  array_format_info fmt_00;
  char (*in_stack_ffffffffffffefa8) [33];
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *local_1048;
  undefined1 local_1018 [32];
  vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_ff8;
  undefined8 local_fe0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_fd0 [6];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vStack_f68;
  ulong local_f50;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_f48;
  ulong local_f40;
  undefined1 local_f38 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_f18;
  undefined1 local_f08 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_ef8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_ee8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_ed8 [2];
  undefined1 local_ec8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_eb8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_ea8;
  long *local_e98 [2];
  long local_e88 [2];
  undefined1 local_e78 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_e58;
  undefined1 local_e48 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e38;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_e18 [2];
  undefined1 local_e08 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_df8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_de8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_dd8 [2];
  undefined1 local_dc8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_db8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_da8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_d98 [2];
  undefined1 local_d88 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_d58 [2];
  undefined1 local_d48 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d38;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_d18 [2];
  undefined1 local_d08 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_cf8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_ce8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_cd8 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_cc8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *local_ca8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_ca0;
  size_t *local_c98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_c90;
  long local_c88;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_true>
  local_c80;
  ulong local_c78;
  ulong local_c70;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_c68;
  undefined1 local_c60 [32];
  vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_c40;
  undefined8 local_c28;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c18 [6];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vStack_bb0;
  string local_b98;
  string local_b78;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b58;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b38;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_b18;
  source_location key_loc;
  vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
  local_a68;
  error_info local_a50;
  region_type local_9f8;
  source_location local_988;
  source_location local_910;
  source_location local_898;
  source_location local_820;
  source_location local_7a8;
  source_location local_730;
  source_location local_6b8;
  source_location local_640;
  source_location local_5c8;
  source_location local_550;
  source_location local_4d8;
  region local_460;
  failure<toml::error_info> local_3f8;
  failure<toml::error_info> local_3a0;
  failure<toml::error_info> local_348;
  failure<toml::error_info> local_2f0;
  failure<toml::error_info> local_298;
  failure<toml::error_info> local_240;
  failure<toml::error_info> local_1e8;
  failure<toml::error_info> local_190;
  failure<toml::error_info> local_138;
  failure<toml::error_info> local_e0;
  failure<toml::error_info> local_88;
  
  local_c68 = keys;
  source_location::source_location(&key_loc,key_reg);
  this = &__return_storage_ptr__->field_1;
  local_f48 = &vStack_bb0;
  uVar23 = (uint)CONCAT71(in_register_00000031,kind);
  local_c88 = (ulong)(uVar23 != 2) * 2 + 0x202;
  local_ca0 = &vStack_f68;
  local_c90 = &(key_reg->source_name_).field_2;
  local_c98 = &key_reg->length_;
  local_ca8 = &(val->region_).source_.
               super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount;
  local_cc8.field_2._8_8_ = &(val->region_).source_name_;
  local_cc8.field_2._M_allocated_capacity = (size_type)&(val->region_).length_;
  local_f40 = 0;
  local_1048 = &current_table_ptr->_M_h;
  do {
    pbVar3 = (local_c68->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    uVar28 = (long)(local_c68->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar3 >> 5;
    if (uVar28 <= local_f40) goto LAB_003667e7;
    __k = (key_type *)(pbVar3 + local_f40);
    local_c70 = local_f40;
    local_f40 = local_f40 + 1;
    if (uVar28 <= local_f40) {
      if (kind == std_table) {
        iVar12 = std::
                 _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 ::find(local_1048,__k);
        if (iVar12.
            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_true>
            ._M_cur != (__node_type *)0x0) {
          if (*(char *)((long)iVar12.
                              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_true>
                              ._M_cur + 0x28) == '\n') {
            pbVar1 = (basic_value<toml::type_config> *)
                     ((long)iVar12.
                            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_true>
                            ._M_cur + 0x28);
            ptVar13 = basic_value<toml::type_config>::as_table_fmt(pbVar1);
            if (ptVar13->fmt == implicit) {
              ptVar14 = basic_value<toml::type_config>::as_table_abi_cxx11_(val);
              p_Var27 = &(ptVar14->_M_h)._M_before_begin;
              local_c80 = iVar12.
                          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_true>
                          ._M_cur;
              do {
                p_Var27 = p_Var27->_M_nxt;
                if (p_Var27 == (__node_base *)0x0) goto LAB_003663ad;
                k = (key_type *)(p_Var27 + 1);
                bVar11 = basic_value<toml::type_config>::contains(pbVar1,k);
                if (bVar11) {
                  local_e98[0] = local_e88;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_e98,
                             "toml::insert_value: failed to insert a table, table keys conflict to each other"
                             ,"");
                  source_location::source_location(&local_820,&key_loc);
                  local_eb8._M_allocated_capacity = (size_type)&local_ea8;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)(local_ec8 + 0x10),"inserting this table","");
                  source_location::source_location
                            ((source_location *)local_c60,(region *)(p_Var27 + 0xe));
                  pvVar15 = basic_value<toml::type_config>::at(pbVar1,k);
                  source_location::source_location((source_location *)local_1018,&pvVar15->region_);
                  make_error_info<toml::source_location,char_const(&)[18],toml::source_location,char_const(&)[21]>
                            (&local_a50,(toml *)local_e98,(string *)&local_820,
                             (source_location *)(local_ec8 + 0x10),(string *)local_c60,
                             (source_location *)"having this value",(char (*) [18])local_1018,
                             (source_location *)"already defined here",
                             (char (*) [21])in_stack_ffffffffffffefa8);
                  err<toml::error_info>(&local_2f0,&local_a50);
                  __return_storage_ptr__->is_ok_ = false;
                  failure<toml::error_info>::failure
                            ((failure<toml::error_info> *)&this->succ_,&local_2f0);
                  failure<toml::error_info>::~failure(&local_2f0);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_a50.suffix_._M_dataplus._M_p != &local_a50.suffix_.field_2) {
                    operator_delete(local_a50.suffix_._M_dataplus._M_p,
                                    local_a50.suffix_.field_2._M_allocated_capacity + 1);
                  }
                  std::
                  vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::~vector(&local_a50.locations_);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_a50.title_._M_dataplus._M_p != &local_a50.title_.field_2) {
                    operator_delete(local_a50.title_._M_dataplus._M_p,
                                    local_a50.title_.field_2._M_allocated_capacity + 1);
                  }
                  source_location::~source_location((source_location *)local_1018);
                  source_location::~source_location((source_location *)local_c60);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_eb8._M_allocated_capacity != &local_ea8) {
                    operator_delete((void *)local_eb8._M_allocated_capacity,
                                    local_ea8._M_allocated_capacity + 1);
                  }
                  source_location::~source_location(&local_820);
                  if (local_e98[0] != local_e88) {
                    operator_delete(local_e98[0],local_e88[0] + 1);
                  }
                }
                else {
                  pvVar15 = basic_value<toml::type_config>::operator[](pbVar1,k);
                  basic_value<toml::type_config>::operator=
                            (pvVar15,(basic_value<toml::type_config> *)(p_Var27 + 5));
                }
              } while (!bVar11);
              if (p_Var27 != (__node_base *)0x0) {
                bVar11 = false;
                goto LAB_003667d1;
              }
LAB_003663ad:
              _Var16._M_cur = local_c80._M_cur;
              ptVar13 = basic_value<toml::type_config>::as_table_fmt(pbVar1);
              ptVar13->fmt = multiline;
              *(element_type **)
               ((long)&((_Var16._M_cur)->
                       super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_true>
                       ).
                       super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>
                       ._M_storage._M_storage + 0x68) =
                   (val->region_).source_.
                   super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr;
              CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                         ((long)&((_Var16._M_cur)->
                                 super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_true>
                                 ).
                                 super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>
                                 ._M_storage._M_storage + 0x70),local_ca8);
              CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              _M_assign((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        ((long)&((_Var16._M_cur)->
                                super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_true>
                                ).
                                super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>
                                ._M_storage._M_storage + 0x78),
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_cc8.field_2._8_8_);
              *(size_t *)
               ((long)&((_Var16._M_cur)->
                       super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_true>
                       ).
                       super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>
                       ._M_storage._M_storage + 200) =
                   *(size_t *)(local_cc8.field_2._M_allocated_capacity + 0x30);
              sVar6 = *(size_t *)local_cc8.field_2._M_allocated_capacity;
              sVar7 = *(size_t *)(local_cc8.field_2._M_allocated_capacity + 8);
              sVar8 = *(size_t *)(local_cc8.field_2._M_allocated_capacity + 0x10);
              sVar9 = *(size_t *)(local_cc8.field_2._M_allocated_capacity + 0x18);
              sVar10 = *(size_t *)(local_cc8.field_2._M_allocated_capacity + 0x28);
              *(size_t *)
               ((long)&((_Var16._M_cur)->
                       super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_true>
                       ).
                       super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>
                       ._M_storage._M_storage + 0xb8) =
                   *(size_t *)(local_cc8.field_2._M_allocated_capacity + 0x20);
              *(size_t *)
               ((long)&((_Var16._M_cur)->
                       super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_true>
                       ).
                       super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>
                       ._M_storage._M_storage + 0xc0) = sVar10;
              *(size_t *)
               ((long)&((_Var16._M_cur)->
                       super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_true>
                       ).
                       super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>
                       ._M_storage._M_storage + 0xa8) = sVar8;
              *(size_t *)
               ((long)&((_Var16._M_cur)->
                       super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_true>
                       ).
                       super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>
                       ._M_storage._M_storage + 0xb0) = sVar9;
              *(size_t *)
               ((long)&((_Var16._M_cur)->
                       super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_true>
                       ).
                       super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>
                       ._M_storage._M_storage + 0x98) = sVar6;
              *(size_t *)
               ((long)&((_Var16._M_cur)->
                       super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_true>
                       ).
                       super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>
                       ._M_storage._M_storage + 0xa0) = sVar7;
              _Var16._M_cur =
                   (__node_type *)
                   std::
                   _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   ::find(local_1048,__k);
              if (_Var16._M_cur != (__node_type *)0x0) goto LAB_00366445;
              goto LAB_00366a44;
            }
          }
          local_e58 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e48
          ;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_e58,
                     "toml::insert_value: failed to insert a table, table already defined","");
          source_location::source_location(&local_7a8,&key_loc);
          local_e78._0_8_ = local_e78 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)(local_e88 + 2),"inserting this","");
          source_location::source_location
                    ((source_location *)local_c60,
                     (region *)
                     ((long)iVar12.
                            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_true>
                            ._M_cur + 0x70));
          make_error_info<toml::source_location,char_const(&)[33]>
                    ((error_info *)local_1018,(toml *)&local_e58,(string *)&local_7a8,
                     (source_location *)(local_e88 + 2),(string *)local_c60,
                     (source_location *)"this table is explicitly defined",in_stack_ffffffffffffefa8
                    );
          err<toml::error_info>(&local_298,(error_info *)local_1018);
          __return_storage_ptr__->is_ok_ = false;
          failure<toml::error_info>::failure((failure<toml::error_info> *)&this->succ_,&local_298);
          failure<toml::error_info>::~failure(&local_298);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_fe0 != local_fd0) {
            operator_delete((void *)local_fe0,local_fd0[0]._M_allocated_capacity + 1);
          }
          std::
          vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::~vector(&local_ff8);
          if ((undefined1 *)local_1018._0_8_ != local_1018 + 0x10) {
            operator_delete((void *)local_1018._0_8_,local_1018._16_8_ + 1);
          }
          source_location::~source_location((source_location *)local_c60);
          if ((undefined1 *)local_e78._0_8_ != local_e78 + 0x10) {
            operator_delete((void *)local_e78._0_8_,local_e78._16_8_ + 1);
          }
          source_location::~source_location(&local_7a8);
          _Var25._M_p = (pointer)local_e48._0_8_;
          pbVar26 = local_e58;
          if (local_e58 !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e48)
          goto LAB_003667c7;
          goto LAB_003667cf;
        }
        std::
        _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,toml::basic_value<toml::type_config>>,std::allocator<std::pair<std::__cxx11::string_const,toml::basic_value<toml::type_config>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
        ::_M_emplace<std::__cxx11::string_const&,toml::basic_value<toml::type_config>>
                  ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,toml::basic_value<toml::type_config>>,std::allocator<std::pair<std::__cxx11::string_const,toml::basic_value<toml::type_config>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                    *)local_1048,__k,val);
        _Var16._M_cur =
             (__node_type *)
             std::
             _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
             ::find(local_1048,__k);
        if (_Var16._M_cur == (__node_type *)0x0) goto LAB_00366a20;
LAB_00366445:
        pbVar18 = (pointer)((long)&((_Var16._M_cur)->
                                   super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_true>
                                   ).
                                   super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>
                                   ._M_storage._M_storage + 0x20);
      }
      else {
        uVar21 = uVar23 & 0xff;
        if (uVar21 != 1) {
          bVar11 = true;
          if (uVar21 == 2) {
            iVar12 = std::
                     _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     ::find(local_1048,__k);
            if (iVar12.
                super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_true>
                ._M_cur != (__node_type *)0x0) {
              local_e18[0] = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_e08;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_e18,
                         "toml::insert_value: failed to insert a value, value already exists","");
              source_location::source_location(&local_730,&key_loc);
              local_e38._M_allocated_capacity = (size_type)&local_e28;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)(local_e48 + 0x10),"inserting this","");
              iVar12 = std::
                       _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                       ::find(local_1048,__k);
              if (iVar12.
                  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_true>
                  ._M_cur != (__node_type *)0x0) {
                source_location::source_location
                          ((source_location *)local_c60,
                           (region *)
                           ((long)iVar12.
                                  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_true>
                                  ._M_cur + 0x70));
                make_error_info<toml::source_location,char_const(&)[25]>
                          ((error_info *)local_1018,(toml *)local_e18,(string *)&local_730,
                           (source_location *)(local_e48 + 0x10),(string *)local_c60,
                           (source_location *)"but value already exists",
                           (char (*) [25])in_stack_ffffffffffffefa8);
                err<toml::error_info>(&local_240,(error_info *)local_1018);
                __return_storage_ptr__->is_ok_ = false;
                failure<toml::error_info>::failure
                          ((failure<toml::error_info> *)&this->succ_,&local_240);
                failure<toml::error_info>::~failure(&local_240);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_fe0 != local_fd0) {
                  operator_delete((void *)local_fe0,local_fd0[0]._M_allocated_capacity + 1);
                }
                std::
                vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::~vector(&local_ff8);
                if ((undefined1 *)local_1018._0_8_ != local_1018 + 0x10) {
                  operator_delete((void *)local_1018._0_8_,local_1018._16_8_ + 1);
                }
                source_location::~source_location((source_location *)local_c60);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_e38._M_allocated_capacity != &local_e28) {
                  operator_delete((void *)local_e38._M_allocated_capacity,
                                  local_e28._M_allocated_capacity + 1);
                }
                source_location::~source_location(&local_730);
                _Var25._M_p = (pointer)local_e08._0_8_;
                pbVar26 = local_e18[0];
                if (local_e18[0] !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e08)
                goto LAB_003667c7;
                goto LAB_003667cf;
              }
              goto LAB_00366a14;
            }
            std::
            _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,toml::basic_value<toml::type_config>>,std::allocator<std::pair<std::__cxx11::string_const,toml::basic_value<toml::type_config>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
            ::_M_emplace<std::__cxx11::string_const&,toml::basic_value<toml::type_config>>
                      ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,toml::basic_value<toml::type_config>>,std::allocator<std::pair<std::__cxx11::string_const,toml::basic_value<toml::type_config>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                        *)local_1048,__k,val);
            _Var16._M_cur =
                 (__node_type *)
                 std::
                 _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 ::find(local_1048,__k);
            if (_Var16._M_cur != (__node_type *)0x0) goto LAB_00366445;
            goto LAB_00366a2c;
          }
          goto LAB_003667d1;
        }
        iVar12 = std::
                 _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 ::find(local_1048,__k);
        if (iVar12.
            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_true>
            ._M_cur != (__node_type *)0x0) {
          if (*(char *)((long)iVar12.
                              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_true>
                              ._M_cur + 0x28) == '\t') {
            pcVar22 = (char *)**(undefined8 **)
                                ((long)iVar12.
                                       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_true>
                                       ._M_cur + 0x30);
            pcVar4 = (char *)(*(undefined8 **)
                               ((long)iVar12.
                                      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_true>
                                      ._M_cur + 0x30))[1];
            if ((pcVar22 != pcVar4) && (*pcVar22 == '\n')) {
              do {
                pcVar22 = pcVar22 + 200;
                if (pcVar22 == pcVar4) goto LAB_003665e6;
              } while (*pcVar22 == '\n');
              if (pcVar22 == pcVar4) {
LAB_003665e6:
                paVar17 = basic_value<toml::type_config>::as_array_fmt
                                    ((basic_value<toml::type_config> *)
                                     ((long)iVar12.
                                            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_true>
                                            ._M_cur + 0x28));
                if (paVar17->fmt != array_of_tables) {
                  local_f18 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_f08;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_f18,
                             "toml::insert_value: failed to insert a table, inline array of tables is immutable"
                             ,"");
                  source_location::source_location(&local_910,&key_loc);
                  local_f38._0_8_ = local_f38 + 0x10;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_f38,"while inserting this","");
                  source_location::source_location
                            ((source_location *)local_c60,
                             (region *)
                             ((long)iVar12.
                                    super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_true>
                                    ._M_cur + 0x70));
                  make_error_info<toml::source_location,char_const(&)[31]>
                            ((error_info *)local_1018,(toml *)&local_f18,(string *)&local_910,
                             (source_location *)local_f38,(string *)local_c60,
                             (source_location *)"this is inline array-of-tables",
                             (char (*) [31])in_stack_ffffffffffffefa8);
                  err<toml::error_info>(&local_3a0,(error_info *)local_1018);
                  __return_storage_ptr__->is_ok_ = false;
                  failure<toml::error_info>::failure
                            ((failure<toml::error_info> *)&this->succ_,&local_3a0);
                  failure<toml::error_info>::~failure(&local_3a0);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_fe0 != local_fd0) {
                    operator_delete((void *)local_fe0,local_fd0[0]._M_allocated_capacity + 1);
                  }
                  std::
                  vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::~vector(&local_ff8);
                  if ((undefined1 *)local_1018._0_8_ != local_1018 + 0x10) {
                    operator_delete((void *)local_1018._0_8_,local_1018._16_8_ + 1);
                  }
                  source_location::~source_location((source_location *)local_c60);
                  if ((undefined1 *)local_f38._0_8_ != local_f38 + 0x10) {
                    operator_delete((void *)local_f38._0_8_,local_f38._16_8_ + 1);
                  }
                  source_location::~source_location(&local_910);
                  _Var25._M_p = (pointer)local_f08._0_8_;
                  pbVar26 = local_f18;
                  if (local_f18 !=
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f08
                     ) goto LAB_003667c7;
                  goto LAB_003667cf;
                }
                this_00 = (vector<toml::basic_value<toml::type_config>,std::allocator<toml::basic_value<toml::type_config>>>
                           *)basic_value<toml::type_config>::as_array
                                       ((basic_value<toml::type_config> *)
                                        ((long)iVar12.
                                               super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_true>
                                               ._M_cur + 0x28));
                std::
                vector<toml::basic_value<toml::type_config>,std::allocator<toml::basic_value<toml::type_config>>>
                ::emplace_back<toml::basic_value<toml::type_config>>(this_00,val);
                iVar12 = std::
                         _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                         ::find(local_1048,__k);
                if (iVar12.
                    super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_true>
                    ._M_cur == (__node_type *)0x0) goto LAB_00366a50;
                paVar19 = basic_value<toml::type_config>::as_array
                                    ((basic_value<toml::type_config> *)
                                     ((long)iVar12.
                                            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_true>
                                            ._M_cur + 0x28));
                goto LAB_0036639a;
              }
            }
          }
          local_ed8[0] = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_ec8;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_ed8,
                     "toml::insert_value: failed to insert an array of tables, value already exists"
                     ,"");
          source_location::source_location(&local_898,&key_loc);
          local_ef8._M_allocated_capacity = (size_type)&local_ee8;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)(local_f08 + 0x10),"while inserting this","");
          source_location::source_location
                    ((source_location *)local_c60,
                     (region *)
                     ((long)iVar12.
                            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_true>
                            ._M_cur + 0x70));
          make_error_info<toml::source_location,char_const(&)[31]>
                    ((error_info *)local_1018,(toml *)local_ed8,(string *)&local_898,
                     (source_location *)(local_f08 + 0x10),(string *)local_c60,
                     (source_location *)"non-table value already exists",
                     (char (*) [31])in_stack_ffffffffffffefa8);
          err<toml::error_info>(&local_348,(error_info *)local_1018);
          __return_storage_ptr__->is_ok_ = false;
          failure<toml::error_info>::failure((failure<toml::error_info> *)&this->succ_,&local_348);
          failure<toml::error_info>::~failure(&local_348);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_fe0 != local_fd0) {
            operator_delete((void *)local_fe0,local_fd0[0]._M_allocated_capacity + 1);
          }
          std::
          vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::~vector(&local_ff8);
          if ((undefined1 *)local_1018._0_8_ != local_1018 + 0x10) {
            operator_delete((void *)local_1018._0_8_,local_1018._16_8_ + 1);
          }
          source_location::~source_location((source_location *)local_c60);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_ef8._M_allocated_capacity != &local_ee8) {
            operator_delete((void *)local_ef8._M_allocated_capacity,
                            local_ee8._M_allocated_capacity + 1);
          }
          source_location::~source_location(&local_898);
          _Var25._M_p = (pointer)local_ec8._0_8_;
          pbVar26 = local_ed8[0];
          if (local_ed8[0] !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_ec8)
          goto LAB_003667c7;
          goto LAB_003667cf;
        }
        basic_value<toml::type_config>::basic_value
                  ((basic_value<toml::type_config> *)local_1018,val);
        __l._M_len = 1;
        __l._M_array = (basic_value<toml::type_config> *)local_1018;
        std::
        vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
        ::vector(&local_a68,__l,(allocator_type *)&local_a50);
        local_b58.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_b58.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_b58.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_9f8.source_.
        super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (key_reg->source_).
                  super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr;
        local_9f8.source_.
        super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi =
             (key_reg->source_).
             super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi;
        (key_reg->source_).
        super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        (key_reg->source_).
        super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)0x0;
        local_9f8.source_name_._M_dataplus._M_p = (pointer)&local_9f8.source_name_.field_2;
        paVar5 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(key_reg->source_name_)._M_dataplus._M_p;
        if (paVar5 == local_c90) {
          local_9f8.source_name_.field_2._M_allocated_capacity = local_c90->_M_allocated_capacity;
          local_9f8.source_name_.field_2._8_8_ = *(undefined8 *)((long)local_c90 + 8);
        }
        else {
          local_9f8.source_name_.field_2._M_allocated_capacity = local_c90->_M_allocated_capacity;
          local_9f8.source_name_._M_dataplus._M_p = (pointer)paVar5;
        }
        fmt_00._0_8_ = (ulong)((uint)local_f50 & 0xffff0000) | 0x400000203;
        local_9f8.source_name_._M_string_length = (key_reg->source_name_)._M_string_length;
        (key_reg->source_name_)._M_dataplus._M_p = (pointer)local_c90;
        (key_reg->source_name_)._M_string_length = 0;
        (key_reg->source_name_).field_2._M_local_buf[0] = '\0';
        local_9f8.last_column_ = local_c98[6];
        local_9f8.length_ = *local_c98;
        local_9f8.first_ = local_c98[1];
        local_9f8.first_line_ = local_c98[2];
        local_9f8.first_column_ = local_c98[3];
        local_9f8.last_ = local_c98[4];
        local_9f8.last_line_ = local_c98[5];
        fmt_00.closing_indent = 0;
        local_f50 = fmt_00._0_8_;
        basic_value<toml::type_config>::basic_value
                  ((basic_value<toml::type_config> *)local_c60,&local_a68,fmt_00,&local_b58,
                   &local_9f8);
        pkVar24 = __k;
        std::
        _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,toml::basic_value<toml::type_config>>,std::allocator<std::pair<std::__cxx11::string_const,toml::basic_value<toml::type_config>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
        ::_M_emplace<std::__cxx11::string_const&,toml::basic_value<toml::type_config>>
                  ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,toml::basic_value<toml::type_config>>,std::allocator<std::pair<std::__cxx11::string_const,toml::basic_value<toml::type_config>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                    *)local_1048,__k,(basic_value<toml::type_config> *)local_c60);
        basic_value<toml::type_config>::cleanup
                  ((basic_value<toml::type_config> *)local_c60,(EVP_PKEY_CTX *)pkVar24);
        CLI::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(local_f48);
        region::~region((region *)local_c18);
        region::~region(&local_9f8);
        CLI::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_b58);
        std::
        vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
        ::~vector(&local_a68);
        basic_value<toml::type_config>::cleanup
                  ((basic_value<toml::type_config> *)local_1018,(EVP_PKEY_CTX *)pkVar24);
        CLI::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(local_ca0);
        region::~region((region *)local_fd0);
        iVar12 = std::
                 _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 ::find(local_1048,__k);
        if (iVar12.
            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_true>
            ._M_cur == (__node_type *)0x0) goto LAB_00366a38;
        paVar19 = basic_value<toml::type_config>::as_array
                            ((basic_value<toml::type_config> *)
                             ((long)iVar12.
                                    super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_true>
                                    ._M_cur + 0x28));
LAB_0036639a:
        pbVar18 = (paVar19->
                  super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish + -1;
      }
      __return_storage_ptr__->is_ok_ = true;
      (__return_storage_ptr__->field_1).succ_.value = pbVar18;
      goto LAB_003667cf;
    }
    iVar12 = std::
             _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
             ::find(local_1048,__k);
    if (iVar12.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_true>
        ._M_cur == (__node_type *)0x0) {
      local_b18._M_buckets = &local_b18._M_single_bucket;
      local_b18._M_bucket_count = 1;
      local_b18._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      local_b18._M_element_count = 0;
      local_b18._M_rehash_policy._M_max_load_factor = 1.0;
      local_b18._M_rehash_policy._4_4_ = 0;
      local_b18._M_rehash_policy._M_next_resize = 0;
      local_b18._M_single_bucket = (__node_base_ptr)0x0;
      local_b38.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_b38.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_b38.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      region::region(&local_460,key_reg);
      fmt._0_8_ = local_c88 + (ulong)((uint)local_c78 & 0xffff0000);
      fmt.name_indent = 0;
      fmt.closing_indent = 0;
      local_c78 = fmt._0_8_;
      basic_value<toml::type_config>::basic_value
                ((basic_value<toml::type_config> *)local_c60,(table_type *)&local_b18,fmt,&local_b38
                 ,&local_460);
      pkVar24 = __k;
      std::
      _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,toml::basic_value<toml::type_config>>,std::allocator<std::pair<std::__cxx11::string_const,toml::basic_value<toml::type_config>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
      ::_M_emplace<std::__cxx11::string_const&,toml::basic_value<toml::type_config>>
                ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,toml::basic_value<toml::type_config>>,std::allocator<std::pair<std::__cxx11::string_const,toml::basic_value<toml::type_config>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                  *)local_1048,__k,(basic_value<toml::type_config> *)local_c60);
      basic_value<toml::type_config>::cleanup
                ((basic_value<toml::type_config> *)local_c60,(EVP_PKEY_CTX *)pkVar24);
      CLI::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(local_f48);
      region::~region((region *)local_c18);
      region::~region(&local_460);
      CLI::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_b38);
      std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable(&local_b18);
      iVar12 = std::
               _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
               ::find(local_1048,__k);
      if (iVar12.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_true>
          ._M_cur == (__node_type *)0x0) {
        std::__throw_out_of_range("_Map_base::at");
LAB_00366a14:
        std::__throw_out_of_range("_Map_base::at");
LAB_00366a20:
        std::__throw_out_of_range("_Map_base::at");
LAB_00366a2c:
        std::__throw_out_of_range("_Map_base::at");
LAB_00366a38:
        std::__throw_out_of_range("_Map_base::at");
LAB_00366a44:
        std::__throw_out_of_range("_Map_base::at");
LAB_00366a50:
        uVar20 = std::__throw_out_of_range("_Map_base::at");
        source_location::~source_location(&key_loc);
        _Unwind_Resume(uVar20);
      }
      local_1048 = &basic_value<toml::type_config>::as_table_abi_cxx11_
                              ((basic_value<toml::type_config> *)
                               ((long)iVar12.
                                      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_true>
                                      ._M_cur + 0x28))->_M_h;
LAB_00365621:
      bVar11 = true;
    }
    else {
      pbVar1 = (basic_value<toml::type_config> *)
               ((long)iVar12.
                      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_true>
                      ._M_cur + 0x28);
      if (*(char *)((long)iVar12.
                          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_true>
                          ._M_cur + 0x28) == '\t') {
        pcVar22 = (char *)**(undefined8 **)
                            ((long)iVar12.
                                   super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_true>
                                   ._M_cur + 0x30);
        pcVar4 = (char *)(*(undefined8 **)
                           ((long)iVar12.
                                  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_true>
                                  ._M_cur + 0x30))[1];
        if ((pcVar22 != pcVar4) && (*pcVar22 == '\n')) {
          do {
            pcVar22 = pcVar22 + 200;
            if (pcVar22 == pcVar4) goto LAB_003660b7;
          } while (*pcVar22 == '\n');
          if (pcVar22 == pcVar4) {
LAB_003660b7:
            paVar17 = basic_value<toml::type_config>::as_array_fmt(pbVar1);
            if (paVar17->fmt == array_of_tables) {
              if (kind != dotted_keys) {
                paVar19 = basic_value<toml::type_config>::as_array(pbVar1);
                local_1048 = &basic_value<toml::type_config>::as_table_abi_cxx11_
                                        ((paVar19->
                                         super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
                                         )._M_impl.super__Vector_impl_data._M_finish + -1)->_M_h;
                goto LAB_00365621;
              }
              local_d98[0] = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_d88;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_d98,
                         "toml::insert_value:dotted key cannot reopen an array-of-tables","");
              source_location::source_location(&local_640,&key_loc);
              local_db8._M_allocated_capacity = (size_type)&local_da8;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)(local_dc8 + 0x10),"inserting this","");
              source_location::source_location
                        ((source_location *)local_c60,
                         (region *)
                         ((long)iVar12.
                                super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_true>
                                ._M_cur + 0x70));
              make_error_info<toml::source_location,char_const(&)[25]>
                        ((error_info *)local_1018,(toml *)local_d98,(string *)&local_640,
                         (source_location *)(local_dc8 + 0x10),(string *)local_c60,
                         (source_location *)"to this array-of-tables.",
                         (char (*) [25])in_stack_ffffffffffffefa8);
              err<toml::error_info>(&local_190,(error_info *)local_1018);
              __return_storage_ptr__->is_ok_ = false;
              failure<toml::error_info>::failure
                        ((failure<toml::error_info> *)&this->succ_,&local_190);
              failure<toml::error_info>::~failure(&local_190);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_fe0 != local_fd0) {
                operator_delete((void *)local_fe0,local_fd0[0]._M_allocated_capacity + 1);
              }
              std::
              vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::~vector(&local_ff8);
              if ((undefined1 *)local_1018._0_8_ != local_1018 + 0x10) {
                operator_delete((void *)local_1018._0_8_,local_1018._16_8_ + 1);
              }
              source_location::~source_location((source_location *)local_c60);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_db8._M_allocated_capacity != &local_da8) {
                operator_delete((void *)local_db8._M_allocated_capacity,
                                local_da8._M_allocated_capacity + 1);
              }
              source_location::~source_location(&local_640);
              _Var25._M_p = (pointer)local_d88._0_8_;
              pbVar26 = local_d98[0];
              if (local_d98[0] !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d88)
              goto LAB_003667c7;
            }
            else {
              local_d58[0] = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_d48;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_d58,
                         "toml::insert_value:inline array of tables are immutable","");
              source_location::source_location(&local_5c8,&key_loc);
              local_d78._M_allocated_capacity = (size_type)&local_d68;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)(local_d88 + 0x10),"inserting this","");
              source_location::source_location
                        ((source_location *)local_c60,
                         (region *)
                         ((long)iVar12.
                                super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_true>
                                ._M_cur + 0x70));
              make_error_info<toml::source_location,char_const(&)[23]>
                        ((error_info *)local_1018,(toml *)local_d58,(string *)&local_5c8,
                         (source_location *)(local_d88 + 0x10),(string *)local_c60,
                         (source_location *)"inline array of tables",
                         (char (*) [23])in_stack_ffffffffffffefa8);
              err<toml::error_info>(&local_138,(error_info *)local_1018);
              __return_storage_ptr__->is_ok_ = false;
              failure<toml::error_info>::failure
                        ((failure<toml::error_info> *)&this->succ_,&local_138);
              failure<toml::error_info>::~failure(&local_138);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_fe0 != local_fd0) {
                operator_delete((void *)local_fe0,local_fd0[0]._M_allocated_capacity + 1);
              }
              std::
              vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::~vector(&local_ff8);
              if ((undefined1 *)local_1018._0_8_ != local_1018 + 0x10) {
                operator_delete((void *)local_1018._0_8_,local_1018._16_8_ + 1);
              }
              source_location::~source_location((source_location *)local_c60);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_d78._M_allocated_capacity != &local_d68) {
                operator_delete((void *)local_d78._M_allocated_capacity,
                                local_d68._M_allocated_capacity + 1);
              }
              source_location::~source_location(&local_5c8);
              _Var25._M_p = (pointer)local_d48._0_8_;
              pbVar26 = local_d58[0];
              if (local_d58[0] !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d48)
              goto LAB_003667c7;
            }
            goto LAB_003667cf;
          }
        }
LAB_00365aee:
        local_dd8[0] = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_dc8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_dd8,
                   "toml::insert_value: failed to insert a value, value already exists","");
        source_location::source_location(&local_6b8,&key_loc);
        local_df8._M_allocated_capacity = (size_type)&local_de8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)(local_e08 + 0x10),"while inserting this","");
        source_location::source_location
                  ((source_location *)local_c60,
                   (region *)
                   ((long)iVar12.
                          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_true>
                          ._M_cur + 0x70));
        make_error_info<toml::source_location,char_const(&)[31]>
                  ((error_info *)local_1018,(toml *)local_dd8,(string *)&local_6b8,
                   (source_location *)(local_e08 + 0x10),(string *)local_c60,
                   (source_location *)"non-table value already exists",
                   (char (*) [31])in_stack_ffffffffffffefa8);
        err<toml::error_info>(&local_1e8,(error_info *)local_1018);
        __return_storage_ptr__->is_ok_ = false;
        failure<toml::error_info>::failure((failure<toml::error_info> *)&this->succ_,&local_1e8);
        failure<toml::error_info>::~failure(&local_1e8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_fe0 != local_fd0) {
          operator_delete((void *)local_fe0,local_fd0[0]._M_allocated_capacity + 1);
        }
        std::
        vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~vector(&local_ff8);
        if ((undefined1 *)local_1018._0_8_ != local_1018 + 0x10) {
          operator_delete((void *)local_1018._0_8_,local_1018._16_8_ + 1);
        }
        source_location::~source_location((source_location *)local_c60);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_df8._M_allocated_capacity != &local_de8) {
          operator_delete((void *)local_df8._M_allocated_capacity,
                          local_de8._M_allocated_capacity + 1);
        }
        source_location::~source_location(&local_6b8);
        _Var25._M_p = (pointer)local_dc8._0_8_;
        pbVar26 = local_dd8[0];
        if (local_dd8[0] !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_dc8) {
LAB_003667c7:
          operator_delete(pbVar26,(ulong)(_Var25._M_p + 1));
        }
      }
      else {
        if (*(char *)((long)iVar12.
                            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_true>
                            ._M_cur + 0x28) != '\n') goto LAB_00365aee;
        ptVar13 = basic_value<toml::type_config>::as_table_fmt(pbVar1);
        if ((ptVar13->fmt & ~dotted) == oneline) {
          local_cd8[0] = &local_cc8;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_cd8,
                     "toml::insert_value: failed to insert a value: inline table is immutable","");
          source_location::source_location(&local_4d8,&key_loc);
          local_cf8._M_allocated_capacity = (size_type)&local_ce8;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)(local_d08 + 0x10),"inserting this","");
          source_location::source_location
                    ((source_location *)local_c60,
                     (region *)
                     ((long)iVar12.
                            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_true>
                            ._M_cur + 0x70));
          make_error_info<toml::source_location,char_const(&)[14]>
                    ((error_info *)local_1018,(toml *)local_cd8,(string *)&local_4d8,
                     (source_location *)(local_d08 + 0x10),(string *)local_c60,
                     (source_location *)"to this table",(char (*) [14])in_stack_ffffffffffffefa8);
          err<toml::error_info>(&local_88,(error_info *)local_1018);
          __return_storage_ptr__->is_ok_ = false;
          failure<toml::error_info>::failure((failure<toml::error_info> *)&this->succ_,&local_88);
          failure<toml::error_info>::~failure(&local_88);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_fe0 != local_fd0) {
            operator_delete((void *)local_fe0,local_fd0[0]._M_allocated_capacity + 1);
          }
          std::
          vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::~vector(&local_ff8);
          if ((undefined1 *)local_1018._0_8_ != local_1018 + 0x10) {
            operator_delete((void *)local_1018._0_8_,local_1018._16_8_ + 1);
          }
          source_location::~source_location((source_location *)local_c60);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_cf8._M_allocated_capacity != &local_ce8) {
            operator_delete((void *)local_cf8._M_allocated_capacity,
                            local_ce8._M_allocated_capacity + 1);
          }
          source_location::~source_location(&local_4d8);
          _Var25._M_p = local_cc8._M_dataplus._M_p;
          pbVar26 = local_cd8[0];
          if (local_cd8[0] == &local_cc8) goto LAB_003667cf;
          goto LAB_003667c7;
        }
        if ((kind != dotted_keys) || (ptVar13->fmt == dotted)) {
          local_1048 = &basic_value<toml::type_config>::as_table_abi_cxx11_(pbVar1)->_M_h;
          goto LAB_00365621;
        }
        local_d18[0] = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_d08;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_d18,"toml::insert_value: reopening a table using dotted keys","")
        ;
        source_location::source_location(&local_550,&key_loc);
        local_d38._M_allocated_capacity = (size_type)&local_d28;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)(local_d48 + 0x10),"dotted key cannot reopen a table","");
        source_location::source_location
                  ((source_location *)local_c60,
                   (region *)
                   ((long)iVar12.
                          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_true>
                          ._M_cur + 0x70));
        make_error_info<toml::source_location,char_const(&)[29]>
                  ((error_info *)local_1018,(toml *)local_d18,(string *)&local_550,
                   (source_location *)(local_d48 + 0x10),(string *)local_c60,
                   (source_location *)"this table is already closed",
                   (char (*) [29])in_stack_ffffffffffffefa8);
        err<toml::error_info>(&local_e0,(error_info *)local_1018);
        __return_storage_ptr__->is_ok_ = false;
        failure<toml::error_info>::failure((failure<toml::error_info> *)&this->succ_,&local_e0);
        failure<toml::error_info>::~failure(&local_e0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_fe0 != local_fd0) {
          operator_delete((void *)local_fe0,local_fd0[0]._M_allocated_capacity + 1);
        }
        std::
        vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~vector(&local_ff8);
        if ((undefined1 *)local_1018._0_8_ != local_1018 + 0x10) {
          operator_delete((void *)local_1018._0_8_,local_1018._16_8_ + 1);
        }
        source_location::~source_location((source_location *)local_c60);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d38._M_allocated_capacity != &local_d28) {
          operator_delete((void *)local_d38._M_allocated_capacity,
                          local_d28._M_allocated_capacity + 1);
        }
        source_location::~source_location(&local_550);
        _Var25._M_p = (pointer)local_d08._0_8_;
        pbVar26 = local_d18[0];
        if (local_d18[0] !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d08)
        goto LAB_003667c7;
      }
LAB_003667cf:
      bVar11 = false;
    }
LAB_003667d1:
  } while (bVar11);
  if (uVar28 <= local_c70) {
LAB_003667e7:
    local_b78._M_dataplus._M_p = (pointer)&local_b78.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_b78,"toml::insert_key: no keys found","");
    paVar2 = &key_loc.file_name_.field_2;
    local_988.file_name_._M_dataplus._M_p = (pointer)&local_988.file_name_.field_2;
    local_988.last_offset_._0_4_ = (undefined4)key_loc.last_offset_;
    local_988.last_offset_._4_4_ = key_loc.last_offset_._4_4_;
    local_988.length_._0_4_ = (undefined4)key_loc.length_;
    local_988.length_._4_4_ = key_loc.length_._4_4_;
    local_988.last_line_._0_4_ = (undefined4)key_loc.last_line_;
    local_988.last_line_._4_4_ = key_loc.last_line_._4_4_;
    local_988.last_column_._0_4_ = (undefined4)key_loc.last_column_;
    local_988.last_column_._4_4_ = key_loc.last_column_._4_4_;
    local_988.first_column_._0_4_ = (undefined4)key_loc.first_column_;
    local_988.first_column_._4_4_ = key_loc.first_column_._4_4_;
    local_988.first_offset_._0_4_ = (undefined4)key_loc.first_offset_;
    local_988.first_offset_._4_4_ = key_loc.first_offset_._4_4_;
    local_988.is_ok_ = key_loc.is_ok_;
    local_988._1_7_ = key_loc._1_7_;
    local_988.first_line_ = key_loc.first_line_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)key_loc.file_name_._M_dataplus._M_p == paVar2) {
      local_988.file_name_.field_2._8_8_ = key_loc.file_name_.field_2._8_8_;
    }
    else {
      local_988.file_name_._M_dataplus._M_p = key_loc.file_name_._M_dataplus._M_p;
    }
    local_988.file_name_._M_string_length = key_loc.file_name_._M_string_length;
    key_loc.file_name_._M_string_length = 0;
    key_loc.file_name_.field_2._M_local_buf[0] = '\0';
    local_988.line_str_.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         key_loc.line_str_.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_988.line_str_.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         key_loc.line_str_.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_988.line_str_.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         key_loc.line_str_.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    key_loc.line_str_.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    key_loc.line_str_.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    key_loc.line_str_.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_b98._M_dataplus._M_p = (pointer)&local_b98.field_2;
    key_loc.file_name_._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b98,"here","");
    make_error_info<>((error_info *)local_c60,&local_b78,&local_988,&local_b98);
    err<toml::error_info>(&local_3f8,(error_info *)local_c60);
    __return_storage_ptr__->is_ok_ = false;
    failure<toml::error_info>::failure((failure<toml::error_info> *)&this->succ_,&local_3f8);
    failure<toml::error_info>::~failure(&local_3f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c28 != local_c18) {
      operator_delete((void *)local_c28,(ulong)(local_c18[0]._M_allocated_capacity + 1));
    }
    std::
    vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector(&local_c40);
    if ((undefined1 *)local_c60._0_8_ != local_c60 + 0x10) {
      operator_delete((void *)local_c60._0_8_,local_c60._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b98._M_dataplus._M_p != &local_b98.field_2) {
      operator_delete(local_b98._M_dataplus._M_p,local_b98.field_2._M_allocated_capacity + 1);
    }
    source_location::~source_location(&local_988);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b78._M_dataplus._M_p != &local_b78.field_2) {
      operator_delete(local_b78._M_dataplus._M_p,local_b78.field_2._M_allocated_capacity + 1);
    }
  }
  source_location::~source_location(&key_loc);
  return __return_storage_ptr__;
}

Assistant:

result<basic_value<TC>*, error_info>
insert_value(const inserting_value_kind kind,
    typename basic_value<TC>::table_type* current_table_ptr,
    const std::vector<typename basic_value<TC>::key_type>& keys, region key_reg,
    basic_value<TC> val)
{
    using value_type = basic_value<TC>;
    using array_type = typename basic_value<TC>::array_type;
    using table_type = typename basic_value<TC>::table_type;

    auto key_loc = source_location(key_reg);

    assert( ! keys.empty());

    // dotted key can insert to dotted key tables defined at the same level.
    // dotted key can NOT reopen a table even if it is implcitly-defined one.
    //
    // [x.y.z] # define x and x.y implicitly.
    // a = 42
    //
    // [x] # reopening implcitly defined table
    // r.s.t = 3.14 # VALID r and r.s are new tables.
    // r.s.u = 2.71 # VALID r and r.s are dotted-key tables. valid.
    //
    // y.z.b = "foo" # INVALID x.y.z are multiline table, not a dotted key.
    // y.c   = "bar" # INVALID x.y is implicit multiline table, not a dotted key.

    // a table cannot reopen dotted-key tables.
    //
    // [t1]
    // t2.t3.v = 0
    // [t1.t2] # INVALID t1.t2 is defined as a dotted-key table.

    for(std::size_t i=0; i<keys.size(); ++i)
    {
        const auto& key = keys.at(i);
        table_type& current_table = *current_table_ptr;

        if(i+1 < keys.size()) // there are more keys. go down recursively...
        {
            const auto found = current_table.find(key);
            if(found == current_table.end()) // not found. add new table
            {
                table_format_info fmt;
                fmt.indent_type = indent_char::none;
                if(kind == inserting_value_kind::dotted_keys)
                {
                    fmt.fmt = table_format::dotted;
                }
                else // table / array of tables
                {
                    fmt.fmt = table_format::implicit;
                }
                current_table.emplace(key, value_type(
                    table_type{}, fmt, std::vector<std::string>{}, key_reg));

                assert(current_table.at(key).is_table());
                current_table_ptr = std::addressof(current_table.at(key).as_table());
            }
            else if (found->second.is_table())
            {
                const auto fmt = found->second.as_table_fmt().fmt;
                if(fmt == table_format::oneline || fmt == table_format::multiline_oneline)
                {
                    // foo = {bar = "baz"} or foo = { \n bar = "baz" \n }
                    return err(make_error_info("toml::insert_value: "
                        "failed to insert a value: inline table is immutable",
                        key_loc, "inserting this",
                        found->second.location(), "to this table"));
                }
                // dotted key cannot reopen a table.
                if(kind ==inserting_value_kind::dotted_keys && fmt != table_format::dotted)
                {
                    return err(make_error_info("toml::insert_value: "
                        "reopening a table using dotted keys",
                        key_loc, "dotted key cannot reopen a table",
                        found->second.location(), "this table is already closed"));
                }
                assert(found->second.is_table());
                current_table_ptr = std::addressof(found->second.as_table());
            }
            else if(found->second.is_array_of_tables())
            {
                // aot = [{this = "type", of = "aot"}] # cannot be reopened
                if(found->second.as_array_fmt().fmt != array_format::array_of_tables)
                {
                    return err(make_error_info("toml::insert_value:"
                        "inline array of tables are immutable",
                        key_loc, "inserting this",
                        found->second.location(), "inline array of tables"));
                }
                // appending to [[aot]]

                if(kind == inserting_value_kind::dotted_keys)
                {
                    // [[array.of.tables]]
                    // [array.of]          # reopening supertable is okay
                    // tables.x = "foo"    # appending `x` to the first table
                    return err(make_error_info("toml::insert_value:"
                        "dotted key cannot reopen an array-of-tables",
                        key_loc, "inserting this",
                        found->second.location(), "to this array-of-tables."));
                }

                // insert_value_by_dotkeys::std_table
                // [[array.of.tables]]
                // [array.of.tables.subtable] # appending to the last aot
                //
                // insert_value_by_dotkeys::array_table
                // [[array.of.tables]]
                // [[array.of.tables.subtable]] # appending to the last aot
                auto& current_array_table = found->second.as_array().back();

                assert(current_array_table.is_table());
                current_table_ptr = std::addressof(current_array_table.as_table());
            }
            else
            {
                return err(make_error_info("toml::insert_value: "
                    "failed to insert a value, value already exists",
                    key_loc, "while inserting this",
                    found->second.location(), "non-table value already exists"));
            }
        }
        else // this is the last key. insert a new value.
        {
            switch(kind)
            {
                case inserting_value_kind::dotted_keys:
                {
                    if(current_table.find(key) != current_table.end())
                    {
                        return err(make_error_info("toml::insert_value: "
                            "failed to insert a value, value already exists",
                            key_loc, "inserting this",
                            current_table.at(key).location(), "but value already exists"));
                    }
                    current_table.emplace(key, std::move(val));
                    return ok(std::addressof(current_table.at(key)));
                }
                case inserting_value_kind::std_table:
                {
                    // defining a new table or reopening supertable
                    auto found = current_table.find(key);
                    if(found == current_table.end()) // define a new aot
                    {
                        current_table.emplace(key, std::move(val));
                        return ok(std::addressof(current_table.at(key)));
                    }
                    else // the table is already defined, reopen it
                    {
                        // assigning a [std.table]. it must be an implicit table.
                        auto& target = found->second;
                        if( ! target.is_table() || // could be an array-of-tables
                            target.as_table_fmt().fmt != table_format::implicit)
                        {
                            return err(make_error_info("toml::insert_value: "
                                "failed to insert a table, table already defined",
                                key_loc, "inserting this",
                                target.location(), "this table is explicitly defined"));
                        }

                        // merge table
                        for(const auto& kv : val.as_table())
                        {
                            if(target.contains(kv.first))
                            {
                                // [x.y.z]
                                // w = "foo"
                                // [x]
                                // y = "bar"
                                return err(make_error_info("toml::insert_value: "
                                    "failed to insert a table, table keys conflict to each other",
                                    key_loc, "inserting this table",
                                    kv.second.location(), "having this value",
                                    target.at(kv.first).location(), "already defined here"));
                            }
                            else
                            {
                                target[kv.first] = kv.second;
                            }
                        }
                        // change implicit -> explicit
                        target.as_table_fmt().fmt = table_format::multiline;
                        // change definition region
                        change_region_of_value(target, val);

                        return ok(std::addressof(current_table.at(key)));
                    }
                }
                case inserting_value_kind::array_table:
                {
                    auto found = current_table.find(key);
                    if(found == current_table.end()) // define a new aot
                    {
                        array_format_info fmt;
                        fmt.fmt = array_format::array_of_tables;
                        fmt.indent_type = indent_char::none;

                        current_table.emplace(key, value_type(
                                array_type{ std::move(val) }, std::move(fmt),
                                std::vector<std::string>{}, std::move(key_reg)
                            ));

                        assert( ! current_table.at(key).as_array().empty());
                        return ok(std::addressof(current_table.at(key).as_array().back()));
                    }
                    else // the array is already defined, append to it
                    {
                        if( ! found->second.is_array_of_tables())
                        {
                            return err(make_error_info("toml::insert_value: "
                                "failed to insert an array of tables, value already exists",
                                key_loc, "while inserting this",
                                found->second.location(), "non-table value already exists"));
                        }
                        if(found->second.as_array_fmt().fmt != array_format::array_of_tables)
                        {
                            return err(make_error_info("toml::insert_value: "
                                "failed to insert a table, inline array of tables is immutable",
                                key_loc, "while inserting this",
                                found->second.location(), "this is inline array-of-tables"));
                        }
                        found->second.as_array().push_back(std::move(val));
                        assert( ! current_table.at(key).as_array().empty());
                        return ok(std::addressof(current_table.at(key).as_array().back()));
                    }
                }
                default: {assert(false);}
            }
        }
    }
    return err(make_error_info("toml::insert_key: no keys found",
                std::move(key_loc), "here"));
}